

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestRunner.cpp
# Opt level: O2

bool glcts::isGLConfigCompatible(configInfo cfgInfo,AOSPConfig *config)

{
  int iVar1;
  
  iVar1 = memcmp(&cfgInfo,&config->redBits,0x1c);
  return iVar1 == 0;
}

Assistant:

static bool isGLConfigCompatible(configInfo cfgInfo, const AOSPConfig& config)
{
	return cfgInfo.redBits == config.redBits && cfgInfo.greenBits == config.greenBits &&
		   cfgInfo.blueBits == config.blueBits && cfgInfo.alphaBits == config.alphaBits &&
		   cfgInfo.depthBits == config.depthBits && cfgInfo.stencilBits == config.stencilBits &&
		   cfgInfo.samples == config.samples;
}